

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

int SstFFSGetDeferred(SstStream Stream,void *Variable,char *Name,size_t DimCount,size_t *Start,
                     size_t *Count,void *Data)

{
  int *piVar1;
  undefined8 *puVar2;
  void *pvVar3;
  FFSReaderMarshalBase *Info;
  long lVar4;
  long *plVar5;
  
  piVar1 = (int *)Stream->ReaderMarshalData;
  if (0 < (long)*piVar1) {
    lVar4 = 0;
    do {
      plVar5 = *(long **)(*(long *)(piVar1 + 2) + lVar4 * 8);
      if ((void *)*plVar5 == Variable) goto LAB_0074310d;
      lVar4 = lVar4 + 1;
    } while (*piVar1 != lVar4);
  }
  plVar5 = (long *)0x0;
LAB_0074310d:
  if (DimCount == 0) {
    memcpy(Data,(void *)(**(long **)(piVar1 + 8) + *(long *)plVar5[2]),
           (long)*(int *)((long)plVar5 + 0x24));
  }
  else {
    CP_verbose(Stream,TraceVerbose,"Get request, Name %s, Start %zu, Count %zu\n",Name,*Start,*Count
              );
    puVar2 = (undefined8 *)malloc(0x38);
    *puVar2 = plVar5;
    *(undefined4 *)(puVar2 + 1) = 0;
    lVar4 = plVar5[3];
    pvVar3 = malloc(lVar4 << 3);
    puVar2[3] = pvVar3;
    memcpy(pvVar3,Start,lVar4 << 3);
    lVar4 = plVar5[3];
    pvVar3 = malloc(lVar4 << 3);
    puVar2[4] = pvVar3;
    memcpy(pvVar3,Count,lVar4 << 3);
    puVar2[5] = Data;
    puVar2[6] = *(undefined8 *)(piVar1 + 6);
    *(undefined8 **)(piVar1 + 6) = puVar2;
  }
  return (uint)(DimCount != 0);
}

Assistant:

extern int SstFFSGetDeferred(SstStream Stream, void *Variable, const char *Name, size_t DimCount,
                             const size_t *Start, const size_t *Count, void *Data)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    int GetFromWriter = 0;
    FFSVarRec Var = LookupVarByKey(Stream, Variable);

    // if Variable is in Metadata (I.E. DimCount == 0), move incoming data to
    // Data area
    if (DimCount == 0)
    {
        void *IncomingDataBase = ((char *)Info->MetadataBaseAddrs[GetFromWriter]) +
                                 Var->PerWriterMetaFieldOffset[GetFromWriter];
        memcpy(Data, IncomingDataBase, Var->ElementSize);
        return 0; // No Sync needed
    }
    else
    {
        CP_verbose(Stream, TraceVerbose, "Get request, Name %s, Start %zu, Count %zu\n", Name,
                   Start[0], Count[0]);
        // Build request structure and enter it into requests list
        FFSArrayRequest Req = malloc(sizeof(*Req));
        Req->VarRec = Var;
        Req->RequestType = Global;
        // make a copy of Start and Count request
        Req->Start = malloc(sizeof(Start[0]) * Var->DimCount);
        memcpy(Req->Start, Start, sizeof(Start[0]) * Var->DimCount);
        Req->Count = malloc(sizeof(Count[0]) * Var->DimCount);
        memcpy(Req->Count, Count, sizeof(Count[0]) * Var->DimCount);
        Req->Data = Data;
        Req->Next = Info->PendingVarRequests;
        Info->PendingVarRequests = Req;
        return 1; // Later Sync needed
    }
}